

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  string *config;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  cmLinkLineComputer *linkLineComputer;
  cmOutputConverter *outputConverter;
  string linkRuleVar_1;
  string extraFlags;
  string linkRuleVar;
  string linkLanguage;
  cmStateDirectory local_c0;
  string local_98;
  string local_78;
  string local_58;
  cmStateSnapshot local_38;
  
  bVar2 = cmGeneratorTarget::IsFrameworkOnApple
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (bVar2) {
    WriteFrameworkRules(this,relink);
    return;
  }
  if (!relink) {
    bVar2 = requireDeviceLinking
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget,
                       (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                       &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        ConfigName);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",(allocator<char> *)&local_58);
      WriteDeviceLibraryRules(this,(string *)&local_c0,false);
      std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  config = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  cmGeneratorTarget::GetLinkerLanguage
            (&local_58,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMAKE_",(allocator<char> *)&local_c0);
  std::__cxx11::string::append((string *)&local_78);
  std::__cxx11::string::append((char *)&local_78);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,&local_98,&local_58);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CMAKE_SHARED_LINKER_FLAGS",(allocator<char> *)&local_38);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar1,&local_98,(string *)&local_c0,config);
  std::__cxx11::string::~string((string *)&local_c0);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  outputConverter =
       &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar1 == (cmLocalUnixMakefileGenerator3 *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot(&local_38,(cmLocalGenerator *)pcVar1);
  cmStateSnapshot::GetDirectory(&local_c0,&local_38);
  linkLineComputer =
       cmMakefileTargetGenerator::CreateLinkLineComputer
                 (&this->super_cmMakefileTargetGenerator,outputConverter,&local_c0);
  cmCommonTargetGenerator::AddModuleDefinitionFlag
            ((cmCommonTargetGenerator *)this,linkLineComputer,&local_98);
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"LINK_WHAT_YOU_USE",(allocator<char> *)&local_38);
  bVar2 = cmGeneratorTarget::GetPropertyAsBool(this_00,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (bVar2) {
    pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
              (pcVar1,&local_98," -Wl,--no-as-needed");
  }
  WriteLibraryRules(this,&local_78,&local_98,relink);
  if (linkLineComputer != (cmLinkLineComputer *)0x0) {
    (*linkLineComputer->_vptr_cmLinkLineComputer[1])(linkLineComputer);
  }
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules(bool relink)
{
  if (this->GeneratorTarget->IsFrameworkOnApple()) {
    this->WriteFrameworkRules(relink);
    return;
  }

  if (!relink) {
    const bool requiresDeviceLinking = requireDeviceLinking(
      *this->GeneratorTarget, *this->LocalGenerator, this->ConfigName);
    if (requiresDeviceLinking) {
      std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
      this->WriteDeviceLibraryRules(linkRuleVar, relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_SHARED_LIBRARY";

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_SHARED_LINKER_FLAGS", this->ConfigName);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory()));

  this->AddModuleDefinitionFlag(linkLineComputer.get(), extraFlags);

  if (this->GeneratorTarget->GetPropertyAsBool("LINK_WHAT_YOU_USE")) {
    this->LocalGenerator->AppendFlags(extraFlags, " -Wl,--no-as-needed");
  }
  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}